

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall inject::no_binding::no_binding(no_binding *this,unique_id component)

{
  ostream *poVar1;
  string local_1c0 [32];
  stringstream local_1a0 [8];
  stringstream oss;
  ostream local_190 [376];
  unique_id local_18;
  unique_id component_local;
  no_binding *this_local;
  
  local_18 = component;
  component_local = (unique_id)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__no_binding_001269e8;
  this->_component = local_18;
  std::__cxx11::string::string((string *)&this->_msg);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"component ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  std::operator<<(poVar1," has no binding");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->_msg,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

no_binding(unique_id component) throw() :
            exception(), _component(component) {
        std::stringstream oss;
        oss << "component " << component << " has no binding";
        _msg = oss.str();
    }